

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O3

void __thiscall testing::internal::ExpectationBase::RetireAllPreRequisites(ExpectationBase *this)

{
  ExpectationBase *pEVar1;
  ExpectationBase *pEVar2;
  ExpectationBase *pEVar3;
  ExpectationBase **ppEVar4;
  _Rb_tree_node_base *p_Var5;
  ExpectationBase *__tmp;
  ExpectationBase *next;
  ExpectationBase *local_50;
  ExpectationBase **local_48;
  iterator local_40;
  ExpectationBase **local_38;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  if (this->retired_ == false) {
    ppEVar4 = (ExpectationBase **)operator_new(8);
    local_40._M_current = ppEVar4 + 1;
    *ppEVar4 = this;
    local_48 = ppEVar4;
    local_38 = local_40._M_current;
    do {
      pEVar1 = local_40._M_current[-1];
      local_40._M_current = local_40._M_current + -1;
      p_Var5 = (pEVar1->immediate_prerequisites_).expectations_._M_t._M_impl.super__Rb_tree_header.
               _M_header._M_left;
      while ((_Rb_tree_header *)p_Var5 !=
             &(pEVar1->immediate_prerequisites_).expectations_._M_t._M_impl.super__Rb_tree_header) {
        pEVar2 = *(ExpectationBase **)(p_Var5 + 1);
        local_50 = pEVar2;
        MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
        pEVar3 = local_50;
        if (pEVar2->retired_ == false) {
          MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
          pEVar3->retired_ = true;
          if (local_40._M_current == local_38) {
            std::
            vector<testing::internal::ExpectationBase*,std::allocator<testing::internal::ExpectationBase*>>
            ::_M_realloc_insert<testing::internal::ExpectationBase*const&>
                      ((vector<testing::internal::ExpectationBase*,std::allocator<testing::internal::ExpectationBase*>>
                        *)&local_48,local_40,&local_50);
          }
          else {
            *local_40._M_current = local_50;
            local_40._M_current = local_40._M_current + 1;
          }
        }
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
        ppEVar4 = local_48;
      }
    } while (ppEVar4 != local_40._M_current);
    if (ppEVar4 != (ExpectationBase **)0x0) {
      operator_delete(ppEVar4,(long)local_38 - (long)ppEVar4);
    }
  }
  return;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
  if (is_retired()) {
    // We can take this short-cut as we never retire an expectation
    // until we have retired all its pre-requisites.
    return;
  }

  ::std::vector<ExpectationBase*> expectations(1, this);
  while (!expectations.empty()) {
    ExpectationBase* exp = expectations.back();
    expectations.pop_back();

    for (ExpectationSet::const_iterator it =
             exp->immediate_prerequisites_.begin();
         it != exp->immediate_prerequisites_.end(); ++it) {
      ExpectationBase* next = it->expectation_base().get();
      if (!next->is_retired()) {
        next->Retire();
        expectations.push_back(next);
      }
    }
  }
}